

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O1

void linenoiseAtExit(void)

{
  char **__ptr;
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (rawmode == '\x01') {
    iVar1 = tcsetattr(0,2,(termios *)&orig_termios);
    if (iVar1 != -1) {
      rawmode = '\0';
    }
  }
  __ptr = history;
  if (history != (char **)0x0) {
    lVar2 = (long)history_len;
    if (0 < lVar2) {
      lVar3 = 0;
      do {
        free(__ptr[lVar3]);
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

static void disableRawMode(int fd) {
    /* Don't even check the return value as it's too late. */
    if (rawmode && tcsetattr(fd,TCSAFLUSH,&orig_termios) != -1)
        rawmode = 0;
}